

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void glcts::getTopNeighbour
               (GLfloat *texture_coordinates,GLuint face,GLuint offset,GLuint width,
               GLfloat *out_neighbour)

{
  GLfloat GVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  if (face < 6) {
    fVar4 = (float)offset / (float)width;
    GVar1 = *texture_coordinates;
    fVar2 = texture_coordinates[1];
    fVar3 = texture_coordinates[2];
    switch(face) {
    default:
      *out_neighbour = GVar1;
      out_neighbour[1] = fVar2;
      fVar3 = fVar3 + fVar4;
      break;
    case 4:
      *out_neighbour = GVar1;
      out_neighbour[1] = fVar2 - fVar4;
      break;
    case 5:
      *out_neighbour = GVar1;
      out_neighbour[1] = fVar4 + fVar2;
    }
    out_neighbour[2] = fVar3;
  }
  return;
}

Assistant:

void getTopNeighbour(const glw::GLfloat* texture_coordinates, glw::GLuint face, glw::GLuint offset, glw::GLuint width,
					 glw::GLfloat* out_neighbour)
{
	glw::GLfloat step = (float)offset / (float)width;

	glw::GLfloat& x = out_neighbour[0];
	glw::GLfloat& y = out_neighbour[1];
	glw::GLfloat& z = out_neighbour[2];

	const glw::GLfloat coord_x = texture_coordinates[0];
	const glw::GLfloat coord_y = texture_coordinates[1];
	const glw::GLfloat coord_z = texture_coordinates[2];

	switch (face)
	{
	case 0: // +X
		x = coord_x;
		y = coord_y;
		z = coord_z + step;
		break;
	case 1: // -X
		x = coord_x;
		y = coord_y;
		z = coord_z + step;
		break;
	case 2: // +Y
		x = coord_x;
		y = coord_y;
		z = coord_z + step;
		break;
	case 3: // -Y
		x = coord_x;
		y = coord_y;
		z = coord_z + step;
		break;
	case 4: // +Z
		x = coord_x;
		y = coord_y - step;
		z = coord_z;
		break;
	case 5: // -Z
		x = coord_x;
		y = coord_y + step;
		z = coord_z;
		break;
	}
}